

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cc
# Opt level: O2

void __thiscall ArgParser::startQuack(ArgParser *this)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"quack",&local_29);
  QPDFArgParser::selectOptionTable(&this->ap,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  bVar1 = QPDFArgParser::isCompleting(&this->ap);
  if (bVar1) {
    bVar1 = QPDFArgParser::isCompleting(&this->ap);
    if (bVar1) {
      iVar2 = QPDFArgParser::argsLeft(&this->ap);
      if (iVar2 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_28,"something",&local_29);
        QPDFArgParser::insertCompletion(&this->ap,&local_28);
        std::__cxx11::string::~string((string *)&local_28);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"anything",&local_29)
        ;
        QPDFArgParser::insertCompletion(&this->ap,&local_28);
        std::__cxx11::string::~string((string *)&local_28);
      }
    }
  }
  return;
}

Assistant:

void
ArgParser::startQuack()
{
    this->ap.selectOptionTable("quack");
    if (this->ap.isCompleting()) {
        if (this->ap.isCompleting() && (this->ap.argsLeft() == 0)) {
            this->ap.insertCompletion("something");
            this->ap.insertCompletion("anything");
        }
        return;
    }
}